

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Deserializer.hpp
# Opt level: O3

void mserialize::detail::
     BuiltinDeserializer<std::unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_>,_void>
     ::deserialize_elems<InputStream>
               (_Hashtable<int,int,std::allocator<int>,std::__detail::_Identity,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                *param_1,int param_2,undefined8 *param_3)

{
  __hashtable *__h;
  T elem;
  _Hashtable<int,int,std::allocator<int>,std::__detail::_Identity,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
  *local_38;
  undefined1 local_2c [4];
  
  if (param_2 != 0) {
    do {
      std::istream::read((char *)*param_3,(long)local_2c);
      local_38 = param_1;
      std::
      _Hashtable<int,int,std::allocator<int>,std::__detail::_Identity,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
      ::
      _M_insert<int,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<int,false>>>>
                (param_1,local_2c,&local_38);
      param_2 = param_2 + -1;
    } while (param_2 != 0);
  }
  return;
}

Assistant:

static void deserialize_elems(
    std::true_type  /* has insert */,
    Sequence& s, std::uint32_t size, InputStream& istream
  )
  {
    // map value_type is pair<const K, V>, we need pair<K, V>
    using T = deep_remove_const_t<typename Sequence::value_type>;

    while (size--)
    {
      T elem;
      mserialize::deserialize(elem, istream);
      s.insert(std::move(elem));
    }
  }